

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O2

void __thiscall icu_63::RegexCompile::matchStartType(RegexCompile *this)

{
  int iVar1;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  uint uVar5;
  UChar32 UVar6;
  int32_t iVar7;
  UnicodeSet *pUVar8;
  UVector64 *pUVar9;
  RegexPattern *pRVar10;
  int iVar11;
  uint uVar12;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  UVector32 forwardedLength;
  UnicodeSet s;
  ulong uVar13;
  
  if (U_ZERO_ERROR < *this->fStatus) {
    return;
  }
  iVar1 = this->fRXPat->fCompiledPat->count;
  UVector32::UVector32(&forwardedLength,iVar1 + 1,this->fStatus);
  UVector32::setSize(&forwardedLength,iVar1 + 1);
  for (iVar11 = 3; iVar11 < iVar1; iVar11 = iVar11 + 1) {
    UVector32::setElementAt(&forwardedLength,0x7fffffff,iVar11);
  }
  uVar13 = 3;
  iVar11 = 0;
  bVar2 = true;
  uVar16 = 0;
  while( true ) {
    pRVar10 = this->fRXPat;
    uVar12 = (uint)uVar13;
    if (iVar1 <= (int)uVar12) break;
    pUVar9 = pRVar10->fCompiledPat;
    iVar4 = pUVar9->count;
    if ((int)uVar12 < 0) {
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      if ((int)uVar12 < iVar4) {
        uVar18 = pUVar9->elements[uVar13];
      }
    }
    if ((int)uVar12 < forwardedLength.count && -1 < (int)uVar12) {
      if (forwardedLength.elements[uVar13] < (int)uVar16) {
        uVar16 = forwardedLength.elements[uVar13];
      }
    }
    else {
      uVar16 = (int)uVar16 >> 0x1f & uVar16;
    }
    uVar15 = (uint)uVar18;
    uVar5 = (uint)(uVar18 >> 0x18) & 0xff;
    switch(uVar5) {
    case 1:
      uVar16 = uVar12 + 1;
      if ((int)uVar16 < forwardedLength.count && -2 < (int)uVar12) goto LAB_00268192;
      goto LAB_002681a2;
    default:
      goto switchD_00267c3c_caseD_2;
    case 3:
      if (uVar16 == 0) {
        UnicodeSet::add(pRVar10->fInitialChars,uVar15 & 0xffffff);
LAB_00268265:
        iVar11 = iVar11 + 2;
      }
      break;
    case 4:
      uVar5 = 0;
      if ((-2 < (int)uVar12) && ((int)(uVar12 + 1) < iVar4)) {
        uVar5 = *(uint *)(pUVar9->elements + (uVar12 + 1)) & 0xffffff;
      }
      if (uVar16 == 0) {
        UVar6 = icu_63::UnicodeString::char32At(&pRVar10->fLiteralText,uVar15 & 0xffffff);
        UnicodeSet::add(this->fRXPat->fInitialChars,UVar6);
        iVar11 = iVar11 + 1;
        pRVar10 = this->fRXPat;
        pRVar10->fInitialStringIdx = uVar15 & 0xffffff;
        pRVar10->fInitialStringLen = uVar5;
      }
      goto LAB_00267fd4;
    case 6:
      uVar5 = uVar15 & 0xffffff;
      bVar2 = false;
      iVar4 = 0;
      if ((int)uVar12 < (int)uVar5) {
        if ((int)uVar5 < forwardedLength.count) {
          iVar4 = forwardedLength.elements[uVar15 & 0xffffff];
        }
        if ((int)uVar16 < iVar4) {
          UVector32::setElementAt(&forwardedLength,uVar16,uVar5);
        }
        goto switchD_00267c3c_caseD_f;
      }
      goto switchD_00267c3c_caseD_2;
    case 10:
      if (uVar16 == 0) {
        UnicodeSet::addAll(pRVar10->fInitialChars,pRVar10->fStaticSets[uVar15 & 0xffffff]);
        goto LAB_00268265;
      }
      break;
    case 0xb:
      if (uVar16 == 0) {
        pUVar8 = (UnicodeSet *)UVector::elementAt(pRVar10->fSets,uVar15 & 0xffffff);
        UnicodeSet::addAll(this->fRXPat->fInitialChars,pUVar8);
        goto LAB_00268265;
      }
      break;
    case 0xc:
    case 0x13:
    case 0x15:
    case 0x1b:
      if (uVar16 == 0) {
        UnicodeSet::clear(pRVar10->fInitialChars);
        UnicodeSet::complement(this->fRXPat->fInitialChars);
        goto LAB_00268265;
      }
      break;
    case 0xd:
      goto switchD_00267c3c_caseD_d;
    case 0xf:
    case 0x12:
    case 0x1c:
    case 0x1d:
    case 0x33:
      goto switchD_00267c3c_caseD_f;
    case 0x16:
      if (uVar16 == 0) {
        UnicodeSet::UnicodeSet(&s);
        UnicodeSet::applyIntPropertyValue(&s,UCHAR_GENERAL_CATEGORY_MASK,0x200,this->fStatus);
        if ((uVar18 & 0xffffff) != 0) {
          UnicodeSet::complement(&s);
        }
        UnicodeSet::addAll(this->fRXPat->fInitialChars,&s);
LAB_0026823b:
        iVar11 = iVar11 + 2;
        UnicodeSet::~UnicodeSet(&s);
      }
      break;
    case 0x17:
      if (!bVar2) goto switchD_00267c3c_caseD_f;
      pRVar10->fStartType = 3;
LAB_00267e55:
      bVar2 = true;
      goto switchD_00267c3c_caseD_2;
    case 0x19:
    case 0x1a:
      uVar5 = 0;
      if ((-2 < (int)uVar12) && (uVar5 = 0, (int)(uVar12 + 1) < iVar4)) {
        uVar5 = *(uint *)(pUVar9->elements + (uVar12 + 1)) & 0xffffff;
      }
      if ((((int)uVar12 < -2) || (iVar4 <= (int)(uVar12 + 2))) ||
         ((int)pUVar9->elements[uVar12 + 2] == 0)) {
        iVar4 = 0;
        if ((int)uVar5 < forwardedLength.count) {
          iVar4 = forwardedLength.elements[uVar5];
        }
        if ((int)uVar16 < iVar4) {
          UVector32::setElementAt(&forwardedLength,uVar16,uVar5);
        }
      }
      uVar12 = uVar12 + 3;
      goto switchD_00267c3c_caseD_f;
    case 0x1e:
    case 0x2b:
      if (bVar2) {
        pRVar10->fStartType = 4;
        goto LAB_00267e55;
      }
      goto switchD_00267c3c_caseD_f;
    case 0x24:
      uVar12 = uVar12 + 1;
switchD_00267c3c_caseD_d:
      uVar5 = uVar15 & 0xffffff;
      if ((int)uVar5 < (int)uVar12) {
        uVar16 = uVar12 + 1;
        if (forwardedLength.count <= (int)uVar16) {
LAB_002681a2:
          bVar2 = false;
          uVar16 = 0;
          goto switchD_00267c3c_caseD_2;
        }
LAB_00268192:
        uVar16 = forwardedLength.elements[uVar16];
      }
      else {
        iVar4 = 0;
        if ((int)uVar5 < forwardedLength.count) {
          iVar4 = forwardedLength.elements[uVar15 & 0xffffff];
        }
        if ((int)uVar16 < iVar4) {
          UVector32::setElementAt(&forwardedLength,uVar16,uVar5);
        }
      }
      goto switchD_00267c3c_caseD_f;
    case 0x25:
    case 0x2c:
      iVar17 = (uVar5 == 0x25) + 1;
      do {
        do {
          do {
            while( true ) {
              do {
                do {
                  iVar14 = (int)uVar13;
                  uVar12 = iVar14 + 1;
                  uVar13 = (ulong)uVar12;
                } while (iVar14 < -1);
              } while (iVar4 <= (int)uVar12);
              uVar15 = (uint)pUVar9->elements[uVar13];
              uVar5 = (uint)((ulong)pUVar9->elements[uVar13] >> 0x18) & 0xff;
              iVar14 = iVar17 + 2;
              if (uVar5 != 0x25) {
                iVar14 = iVar17;
              }
              iVar17 = (uint)(uVar5 == 0x2c) + iVar14;
              if (uVar5 == 6) break;
              if (((uVar5 == 0x30) || (uVar5 == 0x26)) && (iVar17 = iVar17 + -1, iVar17 == 0))
              goto switchD_00267c3c_caseD_2;
            }
            uVar5 = uVar15 & 0xffffff;
          } while (uVar5 <= uVar12);
          iVar14 = 0;
          if ((int)uVar5 < forwardedLength.count) {
            iVar14 = forwardedLength.elements[uVar15 & 0xffffff];
          }
        } while (iVar14 <= (int)uVar16);
        UVector32::setElementAt(&forwardedLength,uVar16,uVar5);
        pUVar9 = this->fRXPat->fCompiledPat;
        iVar4 = pUVar9->count;
      } while( true );
    case 0x27:
      if (uVar16 == 0) {
        uVar15 = uVar15 & 0xffffff;
        UVar3 = u_hasBinaryProperty_63(uVar15,UCHAR_CASE_SENSITIVE);
        if (UVar3 == '\0') {
          UnicodeSet::add(this->fRXPat->fInitialChars,uVar15);
        }
        else {
          UnicodeSet::UnicodeSet(&s,uVar15,uVar15);
          UnicodeSet::closeOver(&s,2);
          UnicodeSet::addAll(this->fRXPat->fInitialChars,&s);
          UnicodeSet::~UnicodeSet(&s);
        }
        goto LAB_00268265;
      }
      break;
    case 0x28:
      uVar5 = 0;
      if ((-2 < (int)uVar12) && ((int)(uVar12 + 1) < iVar4)) {
        uVar5 = *(uint *)(pUVar9->elements + (uVar12 + 1)) & 0xffffff;
      }
      if (uVar16 == 0) {
        UVar6 = icu_63::UnicodeString::char32At(&pRVar10->fLiteralText,uVar15 & 0xffffff);
        UnicodeSet::UnicodeSet(&s);
        findCaseInsensitiveStarters(UVar6,&s);
        UnicodeSet::addAll(this->fRXPat->fInitialChars,&s);
        iVar11 = iVar11 + 2;
        UnicodeSet::~UnicodeSet(&s);
      }
LAB_00267fd4:
      uVar12 = uVar12 + 1;
      uVar15 = uVar16 ^ 0x7fffffff;
      uVar16 = uVar16 + uVar5;
      if (uVar15 <= uVar5) {
        uVar16 = 0x7fffffff;
      }
      bVar2 = false;
      goto switchD_00267c3c_caseD_2;
    case 0x31:
      if (uVar16 == 0) {
        UnicodeSet::UnicodeSet(&s,pRVar10->fStaticSets[uVar15 & 0xffffff]);
        UnicodeSet::complement(&s);
        UnicodeSet::addAll(this->fRXPat->fInitialChars,&s);
        goto LAB_0026823b;
      }
      break;
    case 0x32:
      if (uVar16 == 0) {
        pUVar8 = (UnicodeSet *)UVector::elementAt(pRVar10->fSets,uVar15 & 0xffffff);
        UnicodeSet::addAll(this->fRXPat->fInitialChars,pUVar8);
LAB_00268169:
        iVar11 = iVar11 + 2;
        goto LAB_002681a2;
      }
      goto switchD_00267c3c_caseD_f;
    case 0x34:
      if (uVar16 == 0) {
        UnicodeSet::clear(pRVar10->fInitialChars);
        UnicodeSet::complement(this->fRXPat->fInitialChars);
        goto LAB_00268169;
      }
      goto switchD_00267c3c_caseD_f;
    case 0x38:
      if (uVar16 == 0) {
        UnicodeSet::UnicodeSet(&s);
        UnicodeSet::applyIntPropertyValue(&s,UCHAR_GENERAL_CATEGORY_MASK,0x1000,this->fStatus);
        UnicodeSet::add(&s,9);
        if ((uVar18 & 0xffffff) != 0) {
          UnicodeSet::complement(&s);
        }
        UnicodeSet::addAll(this->fRXPat->fInitialChars,&s);
        goto LAB_0026823b;
      }
      break;
    case 0x39:
    case 0x3a:
      if (uVar16 == 0) {
        UnicodeSet::UnicodeSet(&s);
        UnicodeSet::add(&s,10,0xd);
        UnicodeSet::add(&s,0x85);
        UnicodeSet::add(&s,0x2028,0x2029);
        if ((uVar18 & 0xffffff) != 0) {
          UnicodeSet::complement(&s);
        }
        UnicodeSet::addAll(this->fRXPat->fInitialChars,&s);
        goto LAB_0026823b;
      }
    }
    uVar5 = uVar16 & 0xfffffffe;
    uVar16 = uVar16 + 1;
    if (uVar5 == 0x7ffffffe) {
      uVar16 = 0x7fffffff;
    }
switchD_00267c3c_caseD_f:
    bVar2 = false;
switchD_00267c3c_caseD_2:
    uVar13 = (ulong)(uVar12 + 1);
  }
  Regex8BitSet::init(pRVar10->fInitialChars8,(EVP_PKEY_CTX *)pRVar10->fInitialChars);
  pRVar10 = this->fRXPat;
  if (pRVar10->fStartType == 3) goto LAB_00268363;
  if ((iVar11 == 1) && (0 < pRVar10->fMinMatchLen)) {
    UVar6 = icu_63::UnicodeString::char32At(&pRVar10->fLiteralText,pRVar10->fInitialStringIdx);
    pRVar10 = this->fRXPat;
    pRVar10->fStartType = 5;
  }
  else {
    if (pRVar10->fStartType == 4) goto LAB_00268363;
    if (pRVar10->fMinMatchLen == 0) {
      pRVar10->fStartType = 0;
      goto LAB_00268363;
    }
    iVar7 = UnicodeSet::size(pRVar10->fInitialChars);
    pRVar10 = this->fRXPat;
    if (iVar7 != 1) {
      UVar3 = UnicodeSet::contains(pRVar10->fInitialChars,0,0x10ffff);
      pRVar10 = this->fRXPat;
      if ((UVar3 == '\0') && (0 < pRVar10->fMinMatchLen)) {
        pRVar10->fStartType = 2;
      }
      else {
        pRVar10->fStartType = 0;
      }
      goto LAB_00268363;
    }
    pRVar10->fStartType = 1;
    UVar6 = UnicodeSet::charAt(pRVar10->fInitialChars,0);
    pRVar10 = this->fRXPat;
  }
  pRVar10->fInitialChar = UVar6;
LAB_00268363:
  UVector32::~UVector32(&forwardedLength);
  return;
}

Assistant:

void   RegexCompile::matchStartType() {
    if (U_FAILURE(*fStatus)) {
        return;
    }


    int32_t    loc;                    // Location in the pattern of the current op being processed.
    int32_t    op;                     // The op being processed
    int32_t    opType;                 // The opcode type of the op
    int32_t    currentLen = 0;         // Minimum length of a match to this point (loc) in the pattern
    int32_t    numInitialStrings = 0;  // Number of strings encountered that could match at start.

    UBool      atStart = TRUE;         // True if no part of the pattern yet encountered
                                       //   could have advanced the position in a match.
                                       //   (Maximum match length so far == 0)

    // forwardedLength is a vector holding minimum-match-length values that
    //   are propagated forward in the pattern by JMP or STATE_SAVE operations.
    //   It must be one longer than the pattern being checked because some  ops
    //   will jmp to a end-of-block+1 location from within a block, and we must
    //   count those when checking the block.
    int32_t end = fRXPat->fCompiledPat->size();
    UVector32  forwardedLength(end+1, *fStatus);
    forwardedLength.setSize(end+1);
    for (loc=3; loc<end; loc++) {
        forwardedLength.setElementAt(INT32_MAX, loc);
    }

    for (loc = 3; loc<end; loc++) {
        op = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
        opType = URX_TYPE(op);

        // The loop is advancing linearly through the pattern.
        // If the op we are now at was the destination of a branch in the pattern,
        // and that path has a shorter minimum length than the current accumulated value,
        // replace the current accumulated value.
        if (forwardedLength.elementAti(loc) < currentLen) {
            currentLen = forwardedLength.elementAti(loc);
            U_ASSERT(currentLen>=0 && currentLen < INT32_MAX);
        }

        switch (opType) {
            // Ops that don't change the total length matched
        case URX_RESERVED_OP:
        case URX_END:
        case URX_FAIL:
        case URX_STRING_LEN:
        case URX_NOP:
        case URX_START_CAPTURE:
        case URX_END_CAPTURE:
        case URX_BACKSLASH_B:
        case URX_BACKSLASH_BU:
        case URX_BACKSLASH_G:
        case URX_BACKSLASH_Z:
        case URX_DOLLAR:
        case URX_DOLLAR_M:
        case URX_DOLLAR_D:
        case URX_DOLLAR_MD:
        case URX_RELOC_OPRND:
        case URX_STO_INP_LOC:
        case URX_BACKREF:         // BackRef.  Must assume that it might be a zero length match
        case URX_BACKREF_I:

        case URX_STO_SP:          // Setup for atomic or possessive blocks.  Doesn't change what can match.
        case URX_LD_SP:
            break;

        case URX_CARET:
            if (atStart) {
                fRXPat->fStartType = START_START;
            }
            break;

        case URX_CARET_M:
        case URX_CARET_M_UNIX:
            if (atStart) {
                fRXPat->fStartType = START_LINE;
            }
            break;

        case URX_ONECHAR:
            if (currentLen == 0) {
                // This character could appear at the start of a match.
                //   Add it to the set of possible starting characters.
                fRXPat->fInitialChars->add(URX_VAL(op));
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_SETREF:
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                U_ASSERT(sn > 0 && sn < fRXPat->fSets->size());
                const UnicodeSet *s = (UnicodeSet *)fRXPat->fSets->elementAt(sn);
                fRXPat->fInitialChars->addAll(*s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;

        case URX_LOOP_SR_I:
            // [Set]*, like a SETREF, above, in what it can match,
            //  but may not match at all, so currentLen is not incremented.
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                U_ASSERT(sn > 0 && sn < fRXPat->fSets->size());
                const UnicodeSet *s = (UnicodeSet *)fRXPat->fSets->elementAt(sn);
                fRXPat->fInitialChars->addAll(*s);
                numInitialStrings += 2;
            }
            atStart = FALSE;
            break;

        case URX_LOOP_DOT_I:
            if (currentLen == 0) {
                // .* at the start of a pattern.
                //    Any character can begin the match.
                fRXPat->fInitialChars->clear();
                fRXPat->fInitialChars->complement();
                numInitialStrings += 2;
            }
            atStart = FALSE;
            break;


        case URX_STATIC_SETREF:
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                U_ASSERT(sn>0 && sn<URX_LAST_SET);
                const UnicodeSet *s = fRXPat->fStaticSets[sn];
                fRXPat->fInitialChars->addAll(*s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;



        case URX_STAT_SETREF_N:
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                const UnicodeSet *s = fRXPat->fStaticSets[sn];
                UnicodeSet sc(*s);
                sc.complement();
                fRXPat->fInitialChars->addAll(sc);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;



        case URX_BACKSLASH_D:
            // Digit Char
             if (currentLen == 0) {
                 UnicodeSet s;
                 s.applyIntPropertyValue(UCHAR_GENERAL_CATEGORY_MASK, U_GC_ND_MASK, *fStatus);
                 if (URX_VAL(op) != 0) {
                     s.complement();
                 }
                 fRXPat->fInitialChars->addAll(s);
                 numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_BACKSLASH_H:
            // Horiz white space
            if (currentLen == 0) {
                UnicodeSet s;
                s.applyIntPropertyValue(UCHAR_GENERAL_CATEGORY_MASK, U_GC_ZS_MASK, *fStatus);
                s.add((UChar32)9);   // Tab
                if (URX_VAL(op) != 0) {
                    s.complement();
                }
                fRXPat->fInitialChars->addAll(s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_BACKSLASH_R:       // Any line ending sequence
        case URX_BACKSLASH_V:       // Any line ending code point, with optional negation
            if (currentLen == 0) {
                UnicodeSet s;
                s.add((UChar32)0x0a, (UChar32)0x0d);  // add range
                s.add((UChar32)0x85);
                s.add((UChar32)0x2028, (UChar32)0x2029);
                if (URX_VAL(op) != 0) {
                     // Complement option applies to URX_BACKSLASH_V only.
                     s.complement();
                }
                fRXPat->fInitialChars->addAll(s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;



        case URX_ONECHAR_I:
            // Case Insensitive Single Character.
            if (currentLen == 0) {
                UChar32  c = URX_VAL(op);
                if (u_hasBinaryProperty(c, UCHAR_CASE_SENSITIVE)) {
                    UnicodeSet starters(c, c);
                    starters.closeOver(USET_CASE_INSENSITIVE);
                    // findCaseInsensitiveStarters(c, &starters);
                    //   For ONECHAR_I, no need to worry about text chars that expand on folding into strings.
                    //   The expanded folding can't match the pattern.
                    fRXPat->fInitialChars->addAll(starters);
                } else {
                    // Char has no case variants.  Just add it as-is to the
                    //   set of possible starting chars.
                    fRXPat->fInitialChars->add(c);
                }
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_BACKSLASH_X:   // Grahpeme Cluster.  Minimum is 1, max unbounded.
        case URX_DOTANY_ALL:    // . matches one or two.
        case URX_DOTANY:
        case URX_DOTANY_UNIX:
            if (currentLen == 0) {
                // These constructs are all bad news when they appear at the start
                //   of a match.  Any character can begin the match.
                fRXPat->fInitialChars->clear();
                fRXPat->fInitialChars->complement();
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_JMPX:
            loc++;             // Except for extra operand on URX_JMPX, same as URX_JMP.
            U_FALLTHROUGH;
        case URX_JMP:
            {
                int32_t  jmpDest = URX_VAL(op);
                if (jmpDest < loc) {
                    // Loop of some kind.  Can safely ignore, the worst that will happen
                    //  is that we understate the true minimum length
                    currentLen = forwardedLength.elementAti(loc+1);

                } else {
                    // Forward jump.  Propagate the current min length to the target loc of the jump.
                    U_ASSERT(jmpDest <= end+1);
                    if (forwardedLength.elementAti(jmpDest) > currentLen) {
                        forwardedLength.setElementAt(currentLen, jmpDest);
                    }
                }
            }
            atStart = FALSE;
            break;

        case URX_JMP_SAV:
        case URX_JMP_SAV_X:
            // Combo of state save to the next loc, + jmp backwards.
            //   Net effect on min. length computation is nothing.
            atStart = FALSE;
            break;

        case URX_BACKTRACK:
            // Fails are kind of like a branch, except that the min length was
            //   propagated already, by the state save.
            currentLen = forwardedLength.elementAti(loc+1);
            atStart = FALSE;
            break;


        case URX_STATE_SAVE:
            {
                // State Save, for forward jumps, propagate the current minimum.
                //             of the state save.
                int32_t  jmpDest = URX_VAL(op);
                if (jmpDest > loc) {
                    if (currentLen < forwardedLength.elementAti(jmpDest)) {
                        forwardedLength.setElementAt(currentLen, jmpDest);
                    }
                }
            }
            atStart = FALSE;
            break;




        case URX_STRING:
            {
                loc++;
                int32_t stringLenOp = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                int32_t stringLen   = URX_VAL(stringLenOp);
                U_ASSERT(URX_TYPE(stringLenOp) == URX_STRING_LEN);
                U_ASSERT(stringLenOp >= 2);
                if (currentLen == 0) {
                    // Add the starting character of this string to the set of possible starting
                    //   characters for this pattern.
                    int32_t stringStartIdx = URX_VAL(op);
                    UChar32  c = fRXPat->fLiteralText.char32At(stringStartIdx);
                    fRXPat->fInitialChars->add(c);

                    // Remember this string.  After the entire pattern has been checked,
                    //  if nothing else is identified that can start a match, we'll use it.
                    numInitialStrings++;
                    fRXPat->fInitialStringIdx = stringStartIdx;
                    fRXPat->fInitialStringLen = stringLen;
                }

                currentLen = safeIncrement(currentLen, stringLen);
                atStart = FALSE;
            }
            break;

        case URX_STRING_I:
            {
                // Case-insensitive string.  Unlike exact-match strings, we won't
                //   attempt a string search for possible match positions.  But we
                //   do update the set of possible starting characters.
                loc++;
                int32_t stringLenOp = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                int32_t stringLen   = URX_VAL(stringLenOp);
                U_ASSERT(URX_TYPE(stringLenOp) == URX_STRING_LEN);
                U_ASSERT(stringLenOp >= 2);
                if (currentLen == 0) {
                    // Add the starting character of this string to the set of possible starting
                    //   characters for this pattern.
                    int32_t stringStartIdx = URX_VAL(op);
                    UChar32  c = fRXPat->fLiteralText.char32At(stringStartIdx);
                    UnicodeSet s;
                    findCaseInsensitiveStarters(c, &s);
                    fRXPat->fInitialChars->addAll(s);
                    numInitialStrings += 2;  // Matching on an initial string not possible.
                }
                currentLen = safeIncrement(currentLen, stringLen);
                atStart = FALSE;
            }
            break;

        case URX_CTR_INIT:
        case URX_CTR_INIT_NG:
            {
                // Loop Init Ops.  These don't change the min length, but they are 4 word ops
                //   so location must be updated accordingly.
                // Loop Init Ops.
                //   If the min loop count == 0
                //      move loc forwards to the end of the loop, skipping over the body.
                //   If the min count is > 0,
                //      continue normal processing of the body of the loop.
                int32_t loopEndLoc   = (int32_t)fRXPat->fCompiledPat->elementAti(loc+1);
                        loopEndLoc   = URX_VAL(loopEndLoc);
                int32_t minLoopCount = (int32_t)fRXPat->fCompiledPat->elementAti(loc+2);
                if (minLoopCount == 0) {
                    // Min Loop Count of 0, treat like a forward branch and
                    //   move the current minimum length up to the target
                    //   (end of loop) location.
                    U_ASSERT(loopEndLoc <= end+1);
                    if (forwardedLength.elementAti(loopEndLoc) > currentLen) {
                        forwardedLength.setElementAt(currentLen, loopEndLoc);
                    }
                }
                loc+=3;  // Skips over operands of CTR_INIT
            }
            atStart = FALSE;
            break;


        case URX_CTR_LOOP:
        case URX_CTR_LOOP_NG:
            // Loop ops.
            //  The jump is conditional, backwards only.
            atStart = FALSE;
            break;

        case URX_LOOP_C:
            // More loop ops.  These state-save to themselves.
            //   don't change the minimum match
            atStart = FALSE;
            break;


        case URX_LA_START:
        case URX_LB_START:
            {
                // Look-around.  Scan forward until the matching look-ahead end,
                //   without processing the look-around block.  This is overly pessimistic.

                // Keep track of the nesting depth of look-around blocks.  Boilerplate code for
                //   lookahead contains two LA_END instructions, so count goes up by two
                //   for each LA_START.
                int32_t  depth = (opType == URX_LA_START? 2: 1);
                for (;;) {
                    loc++;
                    op = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                    if (URX_TYPE(op) == URX_LA_START) {
                        depth+=2;
                    }
                    if (URX_TYPE(op) == URX_LB_START) {
                        depth++;
                    }
                    if (URX_TYPE(op) == URX_LA_END || URX_TYPE(op)==URX_LBN_END) {
                        depth--;
                        if (depth == 0) {
                            break;
                        }
                    }
                    if (URX_TYPE(op) == URX_STATE_SAVE) {
                        // Need this because neg lookahead blocks will FAIL to outside
                        //   of the block.
                        int32_t  jmpDest = URX_VAL(op);
                        if (jmpDest > loc) {
                            if (currentLen < forwardedLength.elementAti(jmpDest)) {
                                forwardedLength.setElementAt(currentLen, jmpDest);
                            }
                        }
                    }
                    U_ASSERT(loc <= end);
                }
            }
            break;

        case URX_LA_END:
        case URX_LB_CONT:
        case URX_LB_END:
        case URX_LBN_CONT:
        case URX_LBN_END:
            U_ASSERT(FALSE);     // Shouldn't get here.  These ops should be
                                 //  consumed by the scan in URX_LA_START and LB_START

            break;

        default:
            U_ASSERT(FALSE);
            }

        }


    // We have finished walking through the ops.  Check whether some forward jump
    //   propagated a shorter length to location end+1.
    if (forwardedLength.elementAti(end+1) < currentLen) {
        currentLen = forwardedLength.elementAti(end+1);
    }


    fRXPat->fInitialChars8->init(fRXPat->fInitialChars);


    // Sort out what we should check for when looking for candidate match start positions.
    // In order of preference,
    //     1.   Start of input text buffer.
    //     2.   A literal string.
    //     3.   Start of line in multi-line mode.
    //     4.   A single literal character.
    //     5.   A character from a set of characters.
    //
    if (fRXPat->fStartType == START_START) {
        // Match only at the start of an input text string.
        //    start type is already set.  We're done.
    } else if (numInitialStrings == 1 && fRXPat->fMinMatchLen > 0) {
        // Match beginning only with a literal string.
        UChar32  c = fRXPat->fLiteralText.char32At(fRXPat->fInitialStringIdx);
        U_ASSERT(fRXPat->fInitialChars->contains(c));
        fRXPat->fStartType   = START_STRING;
        fRXPat->fInitialChar = c;
    } else if (fRXPat->fStartType == START_LINE) {
        // Match at start of line in Multi-Line mode.
        // Nothing to do here; everything is already set.
    } else if (fRXPat->fMinMatchLen == 0) {
        // Zero length match possible.  We could start anywhere.
        fRXPat->fStartType = START_NO_INFO;
    } else if (fRXPat->fInitialChars->size() == 1) {
        // All matches begin with the same char.
        fRXPat->fStartType   = START_CHAR;
        fRXPat->fInitialChar = fRXPat->fInitialChars->charAt(0);
        U_ASSERT(fRXPat->fInitialChar != (UChar32)-1);
    } else if (fRXPat->fInitialChars->contains((UChar32)0, (UChar32)0x10ffff) == FALSE &&
        fRXPat->fMinMatchLen > 0) {
        // Matches start with a set of character smaller than the set of all chars.
        fRXPat->fStartType = START_SET;
    } else {
        // Matches can start with anything
        fRXPat->fStartType = START_NO_INFO;
    }

    return;
}